

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::getPoints<(TasGrid::RuleLocal::erule)0,TasGrid::localp_loaded>
          (GridLocalPolynomial *this,double *x)

{
  uint uVar1;
  size_t sVar2;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int j;
  long lVar9;
  double dVar10;
  
  uVar1 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  uVar8 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar8;
  }
  uVar5 = (ulong)(this->super_BaseCanonicalGrid).num_dimensions;
  uVar6 = uVar5;
  for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
    sVar2 = (this->super_BaseCanonicalGrid).points.num_dimensions;
    piVar3 = (this->super_BaseCanonicalGrid).points.indexes.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    for (lVar9 = 0; lVar9 < (int)uVar6; lVar9 = lVar9 + 1) {
      dVar10 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)0>
                         (*(int *)((long)piVar3 + lVar9 * 4 + sVar2 * uVar8));
      x[lVar9] = dVar10;
      uVar6 = (ulong)(uint)(this->super_BaseCanonicalGrid).num_dimensions;
    }
    x = x + uVar5;
    uVar8 = uVar8 + 4;
  }
  return;
}

Assistant:

void GridLocalPolynomial::getPoints(double *x) const {
    int num_points = (std::is_same<points_mode, localp_loaded>::value) ? points.getNumIndexes() : needed.getNumIndexes();
    Utils::Wrapper2D<double> split(num_dimensions, x);
    #pragma omp parallel for schedule(static)
    for(int i=0; i<num_points; i++) {
        int const *p = (std::is_same<points_mode, localp_loaded>::value) ? points.getIndex(i) : needed.getIndex(i);
        double *s = split.getStrip(i);
        for(int j=0; j<num_dimensions; j++)
            s[j] = RuleLocal::getNode<eff_rule>(p[j]);
    }
}